

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_celsius.cc
# Opt level: O3

void __thiscall hwtest::pgraph::MthdCelsiusTexControlA::emulate_mthd(MthdCelsiusTexControlA *this)

{
  pgraph_state *state;
  int iVar1;
  StateTest *pSVar2;
  uint32_t uVar3;
  sbyte sVar4;
  
  state = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp;
  pgraph_celsius_pre_icmd(state);
  if (((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource & 2) == 0) {
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_tex_control_a
    [*(int *)&(this->super_SingleMthdTest).super_MthdTest.field_0x25914] =
         (this->super_SingleMthdTest).super_MthdTest.val & 0x7fffffff;
    iVar1 = *(int *)&(this->super_SingleMthdTest).super_MthdTest.field_0x25914;
    sVar4 = 0xe;
    if ((long)iVar1 == 0) {
      sVar4 = 0;
    }
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_xf_misc_b =
         ((this->super_SingleMthdTest).super_MthdTest.val >> 0x1e & 1) << sVar4 |
         (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_xf_misc_b &
         ~(1 << sVar4);
    pgraph_celsius_icmd(state,iVar1 + 6,
                        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                        bundle_tex_control_a[iVar1],true);
    if (((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.debug_d & 0x10000000) == 0)
    {
      uVar3 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_xf_misc_b;
      pSVar2 = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest;
      (pSVar2->exp).celsius_pipe_junk[2] =
           (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_xf_misc_a;
      (pSVar2->exp).celsius_pipe_junk[3] = uVar3;
    }
  }
  return;
}

Assistant:

void emulate_mthd() override {
		pgraph_celsius_pre_icmd(&exp);
		if (!extr(exp.nsource, 1, 1)) {
			exp.bundle_tex_control_a[idx] = val & 0x7fffffff;
			insrt(exp.celsius_xf_misc_b, idx ? 14 : 0, 1, extr(val, 30, 1));
			pgraph_celsius_icmd(&exp, 6 + idx, exp.bundle_tex_control_a[idx], true);
			if (!extr(exp.debug_d, 28, 1)) {
				exp.celsius_pipe_junk[2] = exp.celsius_xf_misc_a;
				exp.celsius_pipe_junk[3] = exp.celsius_xf_misc_b;
			}
		}
	}